

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:137:20)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:137:20)>
             *this)

{
  MutexGuarded<unsigned_int> *this_00;
  
  this_00 = (this->f).value;
  _::Mutex::lock(&this_00->mutex);
  this_00->value = 0x141;
  _::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }